

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_dependent_entry.cpp
# Opt level: O2

void __thiscall
duckdb::DependencyDependentEntry::DependencyDependentEntry
          (DependencyDependentEntry *this,Catalog *catalog,DependencyInfo *info)

{
  MangledEntryName MStack_78;
  MangledEntryName local_58;
  MangledDependencyName local_38;
  
  DependencyManager::MangleName(&local_58,&(info->subject).entry);
  DependencyManager::MangleName(&MStack_78,(CatalogEntryInfo *)info);
  MangledDependencyName::MangledDependencyName(&local_38,&local_58,&MStack_78);
  DependencyEntry::DependencyEntry(&this->super_DependencyEntry,catalog,DEPENDENT,&local_38,info);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&MStack_78);
  ::std::__cxx11::string::~string((string *)&local_58);
  (this->super_DependencyEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry =
       (_func_int **)&PTR__DependencyDependentEntry_027abac8;
  return;
}

Assistant:

DependencyDependentEntry::DependencyDependentEntry(Catalog &catalog, const DependencyInfo &info)
    : DependencyEntry(catalog, DependencyEntryType::DEPENDENT,
                      MangledDependencyName(DependencyManager::MangleName(info.subject.entry),
                                            DependencyManager::MangleName(info.dependent.entry)),
                      info) {
}